

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int select_cipher(ptls_cipher_suite_t **selected,ptls_cipher_suite_t **candidates,uint8_t *src,
                 uint8_t *end,int server_preference,int server_chacha_priority,
                 ptls_hash_algorithm_t *hash)

{
  int iVar1;
  ushort uVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  ptls_cipher_suite_t *ppVar5;
  bool bVar6;
  
  bVar6 = server_chacha_priority != 0;
  uVar3 = 0xffffffffffffffff;
LAB_00120758:
  do {
    if (src == end) {
      if (uVar3 == 0xffffffffffffffff) {
        iVar1 = 0x28;
      }
      else {
LAB_001207d1:
        ppVar5 = candidates[uVar3];
LAB_001207d5:
        *selected = ppVar5;
        iVar1 = 0;
      }
      return iVar1;
    }
    if ((long)end - (long)src < 2) {
      return 0x32;
    }
    uVar2 = *(ushort *)src << 8 | *(ushort *)src >> 8;
    src = (uint8_t *)((long)src + 2);
    for (uVar4 = 0; ppVar5 = candidates[uVar4], ppVar5 != (ptls_cipher_suite_t *)0x0;
        uVar4 = uVar4 + 1) {
      if ((ppVar5->id == uVar2) &&
         ((hash == (ptls_hash_algorithm_t *)0x0 || (ppVar5->hash == hash)))) {
        if ((bool)(bVar6 & uVar2 == 0x1303 | server_preference == 0)) goto LAB_001207d5;
        if (uVar4 < uVar3) {
          bVar6 = false;
          uVar3 = uVar4;
          if (uVar4 != 0) goto LAB_00120758;
          uVar3 = 0;
          goto LAB_001207d1;
        }
      }
    }
    bVar6 = false;
  } while( true );
}

Assistant:

static int select_cipher(ptls_cipher_suite_t **selected, ptls_cipher_suite_t **candidates, const uint8_t *src,
                         const uint8_t *const end, int server_preference, int server_chacha_priority, ptls_hash_algorithm_t *hash)
{
    size_t found_index = SIZE_MAX;
    int ret;

    while (src != end) {
        uint16_t id;
        if ((ret = ptls_decode16(&id, &src, end)) != 0)
            goto Exit;
        for (size_t i = 0; candidates[i] != NULL; ++i) {
            if (candidates[i]->id == id && (hash == NULL || candidates[i]->hash == hash)) {
                if (server_preference && !(server_chacha_priority && id == PTLS_CIPHER_SUITE_CHACHA20_POLY1305_SHA256)) {
                    /* preserve smallest matching index, and proceed to the next input */
                    if (i < found_index) {
                        found_index = i;
                        break;
                    }
                } else {
                    /* return the pointer matching to the first input that can be used */
                    *selected = candidates[i];
                    goto Exit;
                }
            }
        }
        /* first position of the server list matched (server_preference) */
        if (found_index == 0)
            break;
        /* server preference is overridden only if the first entry of client-provided list is chachapoly */
        server_chacha_priority = 0;
    }
    if (found_index != SIZE_MAX) {
        *selected = candidates[found_index];
        ret = 0;
    } else {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE;
    }

Exit:
    return ret;
}